

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O3

bool __thiscall
crnlib::ktx_texture::init_cubemap
          (ktx_texture *this,uint dim,uint num_mips,uint32 ogl_internal_fmt,uint32 ogl_fmt,
          uint32 ogl_type)

{
  bool bVar1;
  
  clear(this);
  (this->m_header).m_pixelWidth = dim;
  (this->m_header).m_pixelHeight = dim;
  (this->m_header).m_numberOfMipmapLevels = num_mips;
  (this->m_header).m_glInternalFormat = ogl_internal_fmt;
  (this->m_header).m_glFormat = ogl_fmt;
  (this->m_header).m_glType = ogl_type;
  (this->m_header).m_numberOfFaces = 6;
  bVar1 = compute_pixel_info(this);
  return bVar1;
}

Assistant:

bool ktx_texture::init_cubemap(uint dim, uint num_mips, uint32 ogl_internal_fmt, uint32 ogl_fmt, uint32 ogl_type)
    {
        clear();

        m_header.m_pixelWidth = dim;
        m_header.m_pixelHeight = dim;
        m_header.m_numberOfMipmapLevels = num_mips;
        m_header.m_glInternalFormat = ogl_internal_fmt;
        m_header.m_glFormat = ogl_fmt;
        m_header.m_glType = ogl_type;
        m_header.m_numberOfFaces = 6;

        if (!compute_pixel_info())
        {
            return false;
        }

        return true;
    }